

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

bool __thiscall
mocker::detail::InterferenceGraph::isCoalesceAbleToAMachineReg
          (InterferenceGraph *this,Node *v,Node *r)

{
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *x;
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  __node_base *p_Var4;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pmVar2 = std::__detail::
           _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->originalAdjList,v);
  p_Var4 = &(pmVar2->_M_h)._M_before_begin;
  do {
    do {
      do {
        do {
          do {
            p_Var4 = p_Var4->_M_nxt;
            if (p_Var4 == (__node_base *)0x0) goto LAB_0012d35c;
            x = (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 1);
            bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                              (&this->coalesced,(shared_ptr<mocker::nasm::Register> *)x);
          } while (bVar1);
          bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                            (&this->removed,(shared_ptr<mocker::nasm::Register> *)x);
        } while (bVar1);
        pmVar3 = std::__detail::
                 _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&this->curDegree,(key_type *)x);
      } while (*pmVar3 < 0xe);
      bVar1 = isPrecolored((Node *)x);
    } while (bVar1);
    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,x)
    ;
    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&r->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
    ;
    bVar1 = isAdjacent(this,(Node *)&local_40,(Node *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  } while (bVar1);
LAB_0012d35c:
  return p_Var4 == (__node_base *)0x0;
}

Assistant:

bool InterferenceGraph::isCoalesceAbleToAMachineReg(const Node &v,
                                                    const Node &r) {
  // Do not use getCurAdjList here.
  // This condition usually fails very soon, whence we do need to build the
  // entire adjacent list.

  for (auto &t : originalAdjList.at(v)) {
    // Note that since most nodes removed are of degree < K, we may omit the
    // isIn(removed, t) here to speed up the process.
    if (isIn(coalesced, t) || isIn(removed, t))
      continue;
    if (curDegree.at(t) < K)
      continue;
    if (isPrecolored(t))
      continue;
    if (isAdjacent(t, r))
      continue;
    return false;
  }
  return true;
}